

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CMU462::Viewer::err_callback(int error,char *description)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
  poVar1 = std::operator<<(poVar1,"[CMU462] ");
  poVar1 = std::operator<<(poVar1,"\x1b[0m");
  poVar1 = std::operator<<(poVar1,"GLFW Error: ");
  poVar1 = std::operator<<(poVar1,description);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Viewer::err_callback( int error, const char* description ) {
    out_err( "GLFW Error: " << description );
}